

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testCenter<Imath_2_5::Vec3<float>>(char *type)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  float *pfVar5;
  char *in_RDI;
  Box<Imath_2_5::Vec3<float>_> b_1;
  Vec3<float> max;
  Vec3<float> min;
  Box<Imath_2_5::Vec3<float>_> b1;
  uint i;
  Vec3<float> p1;
  Vec3<float> p0;
  Box<Imath_2_5::Vec3<float>_> b0;
  Box<Imath_2_5::Vec3<float>_> b;
  undefined4 in_stack_fffffffffffffed0;
  float in_stack_fffffffffffffed4;
  float in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  Box<Imath_2_5::Vec3<float>_> *in_stack_fffffffffffffee0;
  Box<Imath_2_5::Vec3<float>_> *in_stack_fffffffffffffee8;
  Vec3<float> local_f0;
  Vec3<float> local_e4 [2];
  Vec3<float> local_cc;
  Vec3<float> local_c0 [3];
  uint local_9c;
  Vec3<float> local_98;
  Vec3<float> local_8c;
  Vec3<float> local_80;
  Vec3<float> local_74;
  Vec3<float> local_68;
  Vec3<float> local_5c [3];
  Vec3<float> local_38;
  Vec3<float> local_2c [3];
  char *local_8;
  
  local_8 = in_RDI;
  poVar4 = std::operator<<((ostream *)&std::cout,"    center() for type ");
  poVar4 = std::operator<<(poVar4,local_8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Imath_2_5::Box<Imath_2_5::Vec3<float>_>::Box
            ((Box<Imath_2_5::Vec3<float>_> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  Imath_2_5::Box<Imath_2_5::Vec3<float>_>::center(in_stack_fffffffffffffee8);
  Imath_2_5::Vec3<float>::Vec3(&local_38,0.0);
  bVar1 = Imath_2_5::Vec3<float>::operator==(local_2c,&local_38);
  if (!bVar1) {
    __assert_fail("b.center() == T(0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x2ab,
                  "void (anonymous namespace)::testCenter(const char *) [T = Imath_2_5::Vec3<float>]"
                 );
  }
  Imath_2_5::Vec3<float>::Vec3(local_5c,-1.0);
  Imath_2_5::Vec3<float>::Vec3(&local_68,1.0);
  Imath_2_5::Box<Imath_2_5::Vec3<float>_>::Box
            (in_stack_fffffffffffffee0,
             (Vec3<float> *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
             (Vec3<float> *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  Imath_2_5::Box<Imath_2_5::Vec3<float>_>::center(in_stack_fffffffffffffee8);
  Imath_2_5::Vec3<float>::Vec3(&local_80,0.0);
  bVar1 = Imath_2_5::Vec3<float>::operator==(&local_74,&local_80);
  if (!bVar1) {
    __assert_fail("b0.center() == T(0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x2bd,
                  "void (anonymous namespace)::testCenter(const char *) [T = Imath_2_5::Vec3<float>]"
                 );
  }
  Imath_2_5::Vec3<float>::Vec3(&local_8c);
  Imath_2_5::Vec3<float>::Vec3(&local_98);
  local_9c = 0;
  while( true ) {
    uVar3 = local_9c;
    uVar2 = Imath_2_5::Vec3<float>::dimensions();
    if (uVar2 <= uVar3) break;
    in_stack_fffffffffffffed4 = -(float)(1 << ((char)local_9c + 1U & 0x1f));
    pfVar5 = Imath_2_5::Vec3<float>::operator[](&local_8c,local_9c);
    *pfVar5 = in_stack_fffffffffffffed4;
    uVar3 = Imath_2_5::Vec3<float>::dimensions();
    in_stack_fffffffffffffed8 = (float)(1 << ((char)uVar3 - (char)local_9c & 0x1fU));
    pfVar5 = Imath_2_5::Vec3<float>::operator[](&local_98,local_9c);
    *pfVar5 = in_stack_fffffffffffffed8;
    local_9c = local_9c + 1;
  }
  Imath_2_5::Box<Imath_2_5::Vec3<float>_>::Box
            (in_stack_fffffffffffffee0,(Vec3<float> *)CONCAT44(uVar3,in_stack_fffffffffffffed8),
             (Vec3<float> *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  Imath_2_5::Box<Imath_2_5::Vec3<float>_>::center(in_stack_fffffffffffffee8);
  Imath_2_5::Vec3<float>::operator+
            ((Vec3<float> *)CONCAT44(uVar3,in_stack_fffffffffffffed8),
             (Vec3<float> *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  Imath_2_5::Vec3<float>::operator/
            ((Vec3<float> *)CONCAT44(uVar3,in_stack_fffffffffffffed8),in_stack_fffffffffffffed4);
  bVar1 = Imath_2_5::Vec3<float>::operator==(local_c0,&local_cc);
  if (!bVar1) {
    __assert_fail("b1.center() == (p1 + p0) / 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x2c7,
                  "void (anonymous namespace)::testCenter(const char *) [T = Imath_2_5::Vec3<float>]"
                 );
  }
  Imath_2_5::Vec3<float>::Vec3(local_e4,0.0);
  Imath_2_5::Vec3<float>::Vec3(&local_f0,local_e4);
  uVar2 = Imath_2_5::Vec3<float>::dimensions();
  pfVar5 = Imath_2_5::Vec3<float>::operator[](&local_f0,uVar2 - 1);
  *pfVar5 = 2.0;
  Imath_2_5::Box<Imath_2_5::Vec3<float>_>::Box
            (in_stack_fffffffffffffee0,(Vec3<float> *)CONCAT44(uVar3,in_stack_fffffffffffffed8),
             (Vec3<float> *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  Imath_2_5::Box<Imath_2_5::Vec3<float>_>::center(in_stack_fffffffffffffee8);
  Imath_2_5::Vec3<float>::operator/
            ((Vec3<float> *)CONCAT44(uVar3,in_stack_fffffffffffffed8),in_stack_fffffffffffffed4);
  bVar1 = Imath_2_5::Vec3<float>::operator==
                    ((Vec3<float> *)&stack0xfffffffffffffeec,(Vec3<float> *)&stack0xfffffffffffffee0
                    );
  if (!bVar1) {
    __assert_fail("b.center() == max /2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x2d8,
                  "void (anonymous namespace)::testCenter(const char *) [T = Imath_2_5::Vec3<float>]"
                 );
  }
  return;
}

Assistant:

void
testCenter(const char *type)
{
    cout << "    center() for type " << type << endl;

    //
    // Center of empty box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        assert(b.center() == T(0));
    }

    //
    // Center of non-empty, has-volume box.
    // Boxes are:
    //    2D: [(-1, -1),         (1, 1)       ]
    //    3D: [(-1, -1, -1),     (1, 1, 1)    ]
    //    4D: [(-1, -1, -1, -1), (1, 1, 1, 1) ] 
    //
    // and
    //
    //    2D: [(-2, -4),         ( 8,  2)       ]
    //    3D: [(-2, -4, -6),     (12,  8, 2)    ]
    //    4D: [(-2, -4, -6, -8), (16, 12, 8, 4) ]
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b0(T(-1), T(1));
        assert(b0.center() == T(0));

        T p0;
        T p1;
        for (unsigned int i = 0; i < T::dimensions(); i++)
        {
            p0[i] = -typename T::BaseType(1 << (i + 1));
            p1[i] =  typename T::BaseType(1 << (T::dimensions() - i));
        }
        IMATH_INTERNAL_NAMESPACE::Box<T> b1(p0, p1);
        assert(b1.center() == (p1 + p0) / 2);
    }

    //
    // Center of non-empty, no-volume box.
    // Boxes are:
    //    2D: [(0, 0),       (0, 2)      ]
    //    3D: [(0, 0, 0),    (0, 0, 2)   ]
    //    4D: [(0, 0, 0, 0), (0, 0, 0, 2)]
    //
    {
        T min(0);
        T max = min;
        max[T::dimensions() - 1] = 2;

        IMATH_INTERNAL_NAMESPACE::Box<T> b(min, max);

        assert(b.center() == max /2);
    }
}